

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O0

void __thiscall
Js::ActivationObjectEx::GetPropertyCore
          (ActivationObjectEx *this,PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyIndex PVar1;
  BOOL BVar2;
  ScriptFunction *this_00;
  FunctionBody *this_01;
  undefined1 local_d8 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *currentFunc;
  PropertyIndex slot;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  ActivationObjectEx *this_local;
  
  if (((info != (PropertyValueInfo *)0x0) &&
      (PVar1 = PropertyValueInfo::GetPropertyIndex(info), this->firstFuncSlot <= (uint)PVar1)) &&
     ((uint)PVar1 <= this->lastFuncSlot)) {
    this_00 = Memory::WriteBarrierPtr<Js::ScriptFunction>::operator->(&this->parentFunc);
    ScriptFunction::InvalidateCachedScopeChain(this_00);
    walker.currentFrame.stackCheckCodeHeight = 0;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_d8,requestContext,true,(PVOID)0x0,false);
    do {
      BVar2 = JavascriptStackWalker::GetCaller
                        ((JavascriptStackWalker *)local_d8,
                         (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
      if (BVar2 == 0) goto LAB_013db4b1;
      BVar2 = JavascriptStackWalker::IsEvalCaller((JavascriptStackWalker *)local_d8);
    } while (BVar2 == 0);
    this_01 = JavascriptFunction::GetFunctionBody
                        ((JavascriptFunction *)walker.currentFrame.stackCheckCodeHeight);
    FunctionBody::SetFuncEscapes(this_01,true);
LAB_013db4b1:
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_d8);
  }
  return;
}

Assistant:

void ActivationObjectEx::GetPropertyCore(PropertyValueInfo *info, ScriptContext *requestContext)
    {
        if (info)
        {
            PropertyIndex slot = info->GetPropertyIndex();
            if (slot >= this->firstFuncSlot && slot <= this->lastFuncSlot)
            {
                this->parentFunc->InvalidateCachedScopeChain();

                // If the caller is an eval, then each time we execute the eval we need to invalidate the
                // cached scope chain. We can't rely on detecting the escape each time, because inline
                // cache hits may keep us from entering the runtime. So set a flag to make sure the
                // invalidation always happens.
                JavascriptFunction *currentFunc = nullptr;
                JavascriptStackWalker walker(requestContext);
                while (walker.GetCaller(&currentFunc))
                {
                    if (walker.IsEvalCaller())
                    {
                        //We are walking the stack, so the function body must have been deserialized by this point.
                        currentFunc->GetFunctionBody()->SetFuncEscapes(true);
                        break;
                    }
                }
            }
        }
    }